

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

void __thiscall cmFileCopier::DefaultDirectoryPermissions(cmFileCopier *this)

{
  cmFileCopier *this_local;
  
  this->DirPermissions = 0;
  this->DirPermissions = mode_owner_read | this->DirPermissions;
  this->DirPermissions = mode_owner_write | this->DirPermissions;
  this->DirPermissions = mode_owner_execute | this->DirPermissions;
  this->DirPermissions = mode_group_read | this->DirPermissions;
  this->DirPermissions = mode_group_execute | this->DirPermissions;
  this->DirPermissions = mode_world_read | this->DirPermissions;
  this->DirPermissions = mode_world_execute | this->DirPermissions;
  return;
}

Assistant:

virtual void DefaultDirectoryPermissions()
    {
    // Use read/write/executable permissions.
    this->DirPermissions = 0;
    this->DirPermissions |= mode_owner_read;
    this->DirPermissions |= mode_owner_write;
    this->DirPermissions |= mode_owner_execute;
    this->DirPermissions |= mode_group_read;
    this->DirPermissions |= mode_group_execute;
    this->DirPermissions |= mode_world_read;
    this->DirPermissions |= mode_world_execute;
    }